

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::SliderBehavior
               (ImRect *frame_bb,ImGuiID id,float *v,float v_min,float v_max,float power,
               int decimal_precision,ImGuiSliderFlags flags)

{
  float fVar1;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiWindow *pIVar2;
  ImDrawList *this;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  ImRect *pIVar7;
  bool bVar8;
  ImGuiContext *g;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  p_min = frame_bb->Min;
  p_max = frame_bb->Max;
  IVar4 = GetColorU32(7,1.0);
  RenderFrame(p_min,p_max,IVar4,true,(pIVar3->Style).FrameRounding);
  uVar9 = flags & 1;
  pIVar5 = (ImVec2 *)&(frame_bb->Max).y;
  pIVar6 = pIVar5;
  if (uVar9 == 0) {
    pIVar6 = &frame_bb->Max;
  }
  fVar17 = (pIVar6->x - (&(frame_bb->Min).x)[uVar9]) + -4.0;
  fVar15 = v_max - v_min;
  if (decimal_precision == 0) {
    fVar14 = fVar17 / ((float)(~-(uint)(v_min < v_max) & (uint)(v_min - v_max) |
                              -(uint)(v_min < v_max) & (uint)fVar15) + 1.0);
    fVar16 = (pIVar3->Style).GrabMinSize;
    uVar10 = -(uint)(fVar16 <= fVar14);
    fVar16 = (float)(~uVar10 & (uint)fVar16 | (uint)fVar14 & uVar10);
  }
  else {
    fVar16 = (pIVar3->Style).GrabMinSize;
  }
  if (fVar17 <= fVar16) {
    fVar16 = fVar17;
  }
  pIVar7 = (ImRect *)&(frame_bb->Min).y;
  if (uVar9 == 0) {
    pIVar7 = frame_bb;
  }
  fVar14 = (pIVar7->Min).x;
  if (uVar9 == 0) {
    pIVar5 = &frame_bb->Max;
  }
  fVar1 = pIVar5->x;
  if (0.0 <= v_min * v_max) {
    fVar11 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    fVar11 = powf(ABS(0.0 - v_min),1.0 / power);
    fVar12 = powf(ABS(v_max),1.0 / power);
    fVar11 = fVar11 / (fVar12 + fVar11);
  }
  fVar14 = fVar14 + 2.0 + fVar16 * 0.5;
  if (pIVar3->ActiveId == id) {
    if ((pIVar3->IO).MouseDown[0] == true) {
      fVar12 = 0.0;
      if (0.0 < fVar17 - fVar16) {
        fVar17 = (*(float *)((pIVar3->IO).MouseDown + (ulong)uVar9 * 4 + -8) - fVar14) /
                 (fVar17 - fVar16);
        fVar12 = 1.0;
        if (fVar17 <= 1.0) {
          fVar12 = fVar17;
        }
        fVar12 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar12);
      }
      if (uVar9 != 0) {
        fVar12 = 1.0 - fVar12;
      }
      if (power <= 1.00001 && 0.99999 <= power) {
        fVar17 = fVar12 * fVar15 + v_min;
      }
      else {
        if (fVar11 <= fVar12) {
          uVar10 = -(uint)(1e-06 < ABS(fVar11 + -1.0));
          fVar13 = powf((float)(~uVar10 & (uint)fVar12 |
                               (uint)((fVar12 - fVar11) / (1.0 - fVar11)) & uVar10),power);
          fVar17 = (float)(-(uint)(0.0 <= v_min) & (uint)v_min);
          fVar12 = v_max;
        }
        else {
          fVar13 = powf(1.0 - fVar12 / fVar11,power);
          fVar17 = v_max;
          fVar12 = v_min;
          if (0.0 <= v_max) {
            fVar17 = 0.0;
          }
        }
        fVar17 = (fVar12 - fVar17) * fVar13 + fVar17;
      }
      fVar17 = RoundScalar(fVar17,decimal_precision);
      if ((*v != fVar17) || (NAN(*v) || NAN(fVar17))) {
        *v = fVar17;
        bVar8 = true;
      }
      else {
        bVar8 = false;
      }
      goto LAB_0015d0b0;
    }
    ClearActiveID();
  }
  bVar8 = false;
LAB_0015d0b0:
  fVar17 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    fVar17 = *v;
    fVar13 = v_max;
    fVar12 = v_min;
    if (v_max <= v_min) {
      fVar13 = v_min;
      fVar12 = v_max;
    }
    if (fVar17 <= fVar13) {
      fVar13 = fVar17;
    }
    fVar17 = (float)(~-(uint)(fVar17 < fVar12) & (uint)fVar13 |
                    (uint)fVar12 & -(uint)(fVar17 < fVar12));
    if (power <= 1.00001 && 0.99999 <= power) {
      fVar17 = (fVar17 - v_min) / fVar15;
    }
    else if (0.0 <= fVar17) {
      fVar15 = (float)(~-(uint)(v_min <= 0.0) & (uint)v_min);
      fVar15 = powf((fVar17 - fVar15) / (v_max - fVar15),1.0 / power);
      fVar17 = (1.0 - fVar11) * fVar15 + fVar11;
    }
    else {
      fVar15 = 0.0;
      if (v_max <= 0.0) {
        fVar15 = v_max;
      }
      fVar15 = powf(1.0 - (fVar17 - v_min) / (fVar15 - v_min),1.0 / power);
      fVar17 = fVar11 * (1.0 - fVar15);
    }
  }
  if (uVar9 != 0) {
    fVar17 = 1.0 - fVar17;
  }
  fVar14 = (((fVar1 + -2.0) - fVar16 * 0.5) - fVar14) * fVar17 + fVar14;
  if (uVar9 != 0) {
    local_40.x = (frame_bb->Min).x + 2.0;
    local_38.x = (frame_bb->Max).x + -2.0;
    local_40.y = -fVar16 * 0.5 + fVar14;
    local_38.y = fVar16 * 0.5 + fVar14;
  }
  else {
    local_40.x = -fVar16 * 0.5 + fVar14;
    local_38.x = fVar16 * 0.5 + fVar14;
    local_40.y = (frame_bb->Min).y + 2.0;
    local_38.y = (frame_bb->Max).y + -2.0;
  }
  this = pIVar2->DrawList;
  IVar4 = GetColorU32(pIVar3->ActiveId == id | 0x14,1.0);
  ImDrawList::AddRectFilled(this,&local_40,&local_38,IVar4,(pIVar3->Style).GrabRounding,-1);
  return bVar8;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& frame_bb, ImGuiID id, float* v, float v_min, float v_max, float power, int decimal_precision, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = g.Style;

    // Draw frame
    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const bool is_non_linear = (power < 1.0f-0.00001f) || (power > 1.0f+0.00001f);
    const bool is_horizontal = (flags & ImGuiSliderFlags_Vertical) == 0;

    const float grab_padding = 2.0f;
    const float slider_sz = is_horizontal ? (frame_bb.GetWidth() - grab_padding * 2.0f) : (frame_bb.GetHeight() - grab_padding * 2.0f);
    float grab_sz;
    if (decimal_precision != 0)
        grab_sz = ImMin(style.GrabMinSize, slider_sz);
    else
        grab_sz = ImMin(ImMax(1.0f * (slider_sz / ((v_min < v_max ? v_max - v_min : v_min - v_max) + 1.0f)), style.GrabMinSize), slider_sz);  // Integer sliders, if possible have the grab size represent 1 unit
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = (is_horizontal ? frame_bb.Min.x : frame_bb.Min.y) + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = (is_horizontal ? frame_bb.Max.x : frame_bb.Max.y) - grab_padding - grab_sz*0.5f;

    // For logarithmic sliders that cross over sign boundary we want the exponential increase to be symmetric around 0.0f
    float linear_zero_pos = 0.0f;   // 0.0->1.0f
    if (v_min * v_max < 0.0f)
    {
        // Different sign
        const float linear_dist_min_to_0 = powf(fabsf(0.0f - v_min), 1.0f/power);
        const float linear_dist_max_to_0 = powf(fabsf(v_max - 0.0f), 1.0f/power);
        linear_zero_pos = linear_dist_min_to_0 / (linear_dist_min_to_0+linear_dist_max_to_0);
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process clicking on the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.IO.MouseDown[0])
        {
            const float mouse_abs_pos = is_horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
            clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
            if (!is_horizontal)
                clicked_t = 1.0f - clicked_t;
            set_new_value = true;
        }
        else
        {
            ClearActiveID();
        }

        if (set_new_value)
        {
            float new_value;
            if (is_non_linear)
            {
                // Account for logarithmic scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = powf(a, power);
                    new_value = ImLerp(ImMin(v_max,0.0f), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (fabsf(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = powf(a, power);
                    new_value = ImLerp(ImMax(v_min,0.0f), v_max, a);
                }
            }
            else
            {
                // Linear slider
                new_value = ImLerp(v_min, v_max, clicked_t);
            }

            // Round past decimal precision
            new_value = RoundScalar(new_value, decimal_precision);
            if (*v != new_value)
            {
                *v = new_value;
                value_changed = true;
            }
        }
    }

    // Draw
    float grab_t = SliderBehaviorCalcRatioFromValue(*v, v_min, v_max, power, linear_zero_pos);
    if (!is_horizontal)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    ImRect grab_bb;
    if (is_horizontal)
        grab_bb = ImRect(ImVec2(grab_pos - grab_sz*0.5f, frame_bb.Min.y + grab_padding), ImVec2(grab_pos + grab_sz*0.5f, frame_bb.Max.y - grab_padding));
    else
        grab_bb = ImRect(ImVec2(frame_bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f), ImVec2(frame_bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f));
    window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    return value_changed;
}